

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O0

Value * __thiscall optimization::inlineFunc::Rewriter::cast_value(Rewriter *this,Value *val)

{
  char *pcVar1;
  VarId *pVVar2;
  int in_EDX;
  undefined4 in_register_00000014;
  key_type *in_RSI;
  Value *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  int32_t i_00;
  VarId *i;
  Value *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  
  i_00 = (int32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  this_00 = (Value *)CONCAT44(in_register_00000014,in_EDX);
  pcVar1 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)&this_00->field_0x8,(char *)in_RSI,in_EDX);
  if (pcVar1 == (char *)0x0) {
    std::get<int,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x15c784);
    mir::inst::Value::Value(this_00,i_00);
  }
  else {
    i = (VarId *)(in_RSI + 4);
    pVVar2 = std::get<mir::inst::VarId,int,mir::inst::VarId>
                       ((variant<int,_mir::inst::VarId> *)0x15c7ad);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               CONCAT44(pVVar2->id,in_stack_ffffffffffffffd0),in_RSI);
    mir::inst::VarId::VarId((VarId *)this_00,(uint32_t)((ulong)i >> 0x20));
    mir::inst::Value::Value(this_00,i);
  }
  return in_RDI;
}

Assistant:

mir::inst::Value cast_value(mir::inst::Value val) {
    if (val.index() == 0) {
      return std::get<int>(val);
    }
    return mir::inst::VarId(
        var_cast_map.at(std::get<mir::inst::VarId>(val).id));
  }